

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O2

Interval1f __thiscall
embree::motion_derivative_regression_test::run::EvalFunc::operator()(EvalFunc *this,Interval1f *t)

{
  Interval1f IVar1;
  uint uVar2;
  undefined8 *in_RDX;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  
  fVar3 = (float)*in_RDX;
  fVar8 = (float)((ulong)*in_RDX >> 0x20);
  fVar5 = fVar3 * -116.007454;
  fVar6 = fVar8 * -116.007454;
  fVar7 = fVar6;
  if (fVar6 <= fVar5) {
    fVar7 = fVar5;
    fVar5 = fVar6;
  }
  fVar6 = fVar3 * 411.19305;
  fVar11 = fVar8 * 411.19305;
  fVar4 = fVar11;
  if (fVar11 <= fVar6) {
    fVar4 = fVar6;
    fVar6 = fVar11;
  }
  fVar11 = fVar3 * -160.02002;
  fVar12 = fVar8 * -160.02002;
  fVar16 = fVar12;
  if (fVar12 <= fVar11) {
    fVar16 = fVar11;
    fVar11 = fVar12;
  }
  fVar9 = fVar3 * fVar11;
  fVar11 = fVar11 * fVar8;
  fVar14 = fVar3 * fVar16;
  fVar16 = fVar8 * fVar16;
  fVar12 = fVar9;
  if (fVar11 <= fVar9) {
    fVar12 = fVar11;
  }
  fVar10 = fVar14;
  if (fVar16 <= fVar14) {
    fVar10 = fVar16;
  }
  if (fVar10 <= fVar12) {
    fVar12 = fVar10;
  }
  fVar12 = fVar12 + fVar6 + -198.23581;
  if (fVar11 <= fVar9) {
    fVar11 = fVar9;
  }
  if (fVar16 <= fVar14) {
    fVar16 = fVar14;
  }
  if (fVar16 <= fVar11) {
    fVar16 = fVar11;
  }
  fVar16 = fVar16 + fVar4 + -198.23581;
  uVar2 = (uint)(fVar3 * 5.438017 < fVar8 * 5.438017);
  cos((embree *)&local_20,
      (double)CONCAT44((uint)(fVar8 * 5.438017) & (int)(uVar2 << 0x1f) >> 0x1f,
                       (uint)(fVar3 * 5.438017) & (int)(uVar2 << 0x1f) >> 0x1f));
  fVar8 = local_20 * fVar12;
  fVar12 = fVar12 * local_1c;
  local_20 = local_20 * fVar16;
  fVar16 = fVar16 * local_1c;
  fVar3 = fVar8;
  if (fVar12 <= fVar8) {
    fVar3 = fVar12;
  }
  fVar6 = local_20;
  if (fVar16 <= local_20) {
    fVar6 = fVar16;
  }
  if (fVar6 <= fVar3) {
    fVar3 = fVar6;
  }
  if (fVar12 <= fVar8) {
    fVar12 = fVar8;
  }
  if (fVar16 <= local_20) {
    fVar16 = local_20;
  }
  if (fVar16 <= fVar12) {
    fVar16 = fVar12;
  }
  fVar4 = (float)*in_RDX;
  fVar11 = (float)((ulong)*in_RDX >> 0x20);
  fVar8 = fVar4 * 786.18195;
  fVar12 = fVar11 * 786.18195;
  fVar6 = fVar12;
  if (fVar12 <= fVar8) {
    fVar6 = fVar8;
    fVar8 = fVar12;
  }
  fVar12 = fVar4 * -559.99316;
  fVar14 = fVar11 * -559.99316;
  fVar9 = fVar14;
  if (fVar14 <= fVar12) {
    fVar9 = fVar12;
    fVar12 = fVar14;
  }
  fVar10 = fVar4 * fVar12;
  fVar12 = fVar12 * fVar11;
  fVar15 = fVar4 * fVar9;
  fVar9 = fVar11 * fVar9;
  fVar14 = fVar10;
  if (fVar12 <= fVar10) {
    fVar14 = fVar12;
  }
  fVar13 = fVar15;
  if (fVar9 <= fVar15) {
    fVar13 = fVar9;
  }
  if (fVar13 <= fVar14) {
    fVar14 = fVar13;
  }
  fVar14 = fVar14 + fVar8 + -320.57147;
  if (fVar12 <= fVar10) {
    fVar12 = fVar10;
  }
  if (fVar9 <= fVar15) {
    fVar9 = fVar15;
  }
  if (fVar9 <= fVar12) {
    fVar9 = fVar12;
  }
  fVar9 = fVar9 + fVar6 + -320.57147;
  uVar2 = (uint)(fVar4 * 5.438017 < fVar11 * 5.438017);
  sin((embree *)&local_28,
      (double)CONCAT44((uint)(fVar11 * 5.438017) & (int)(uVar2 << 0x1f) >> 0x1f,
                       (uint)(fVar4 * 5.438017) & (int)(uVar2 << 0x1f) >> 0x1f));
  fVar6 = local_28 * fVar14;
  fVar14 = fVar14 * local_24;
  local_28 = local_28 * fVar9;
  fVar9 = fVar9 * local_24;
  fVar8 = fVar6;
  if (fVar14 <= fVar6) {
    fVar8 = fVar14;
  }
  fVar4 = local_28;
  if (fVar9 <= local_28) {
    fVar4 = fVar9;
  }
  if (fVar4 <= fVar8) {
    fVar8 = fVar4;
  }
  if (fVar14 <= fVar6) {
    fVar14 = fVar6;
  }
  if (fVar9 <= local_28) {
    fVar9 = local_28;
  }
  if (fVar9 <= fVar14) {
    fVar9 = fVar14;
  }
  *(float *)this = fVar8 + fVar3 + fVar5 + 62.787994;
  *(float *)(this + 4) = fVar9 + fVar16 + fVar7 + 62.787994;
  IVar1.upper = 0.0;
  IVar1.lower = local_28;
  return IVar1;
}

Assistant:

Interval1f operator()(Interval1f const& t) const {
          return sin(10.0f * t) * 100.0f * t*t*t*t*t;
        }